

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

BrandedDecl * __thiscall
capnp::compiler::BrandedDecl::operator=(BrandedDecl *this,BrandedDecl *other)

{
  uint *puVar1;
  BrandScope *pBVar2;
  Disposer *pDVar3;
  BrandScope *pBVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  StructDataBitCount SVar12;
  int iVar13;
  undefined4 uVar14;
  StructPointerCount SVar15;
  undefined2 uVar16;
  Refcounted *refcounted;
  
  kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>::
  operator=(&this->body,&other->body);
  uVar5 = *(undefined4 *)((long)&(other->source)._reader.segment + 4);
  uVar6 = *(undefined4 *)&(other->source)._reader.capTable;
  uVar7 = *(undefined4 *)((long)&(other->source)._reader.capTable + 4);
  uVar8 = *(undefined4 *)&(other->source)._reader.data;
  uVar9 = *(undefined4 *)((long)&(other->source)._reader.data + 4);
  uVar10 = *(undefined4 *)&(other->source)._reader.pointers;
  uVar11 = *(undefined4 *)((long)&(other->source)._reader.pointers + 4);
  SVar12 = (other->source)._reader.dataSize;
  SVar15 = (other->source)._reader.pointerCount;
  uVar16 = *(undefined2 *)&(other->source)._reader.field_0x26;
  iVar13 = (other->source)._reader.nestingLimit;
  uVar14 = *(undefined4 *)&(other->source)._reader.field_0x2c;
  *(undefined4 *)&(this->source)._reader.segment = *(undefined4 *)&(other->source)._reader.segment;
  *(undefined4 *)((long)&(this->source)._reader.segment + 4) = uVar5;
  *(undefined4 *)&(this->source)._reader.capTable = uVar6;
  *(undefined4 *)((long)&(this->source)._reader.capTable + 4) = uVar7;
  *(undefined4 *)&(this->source)._reader.data = uVar8;
  *(undefined4 *)((long)&(this->source)._reader.data + 4) = uVar9;
  *(undefined4 *)&(this->source)._reader.pointers = uVar10;
  *(undefined4 *)((long)&(this->source)._reader.pointers + 4) = uVar11;
  (this->source)._reader.dataSize = SVar12;
  (this->source)._reader.pointerCount = SVar15;
  *(undefined2 *)&(this->source)._reader.field_0x26 = uVar16;
  (this->source)._reader.nestingLimit = iVar13;
  *(undefined4 *)&(this->source)._reader.field_0x2c = uVar14;
  if ((this->body).tag == 1) {
    pBVar2 = (other->brand).ptr;
    puVar1 = &(pBVar2->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    pDVar3 = (this->brand).disposer;
    pBVar4 = (this->brand).ptr;
    (this->brand).disposer = (Disposer *)pBVar2;
    (this->brand).ptr = pBVar2;
    if (pBVar4 != (BrandScope *)0x0) {
      (**pDVar3->_vptr_Disposer)
                (pDVar3,(pBVar4->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                        (long)&(pBVar4->super_Refcounted).super_Disposer._vptr_Disposer);
    }
  }
  return this;
}

Assistant:

BrandedDecl& BrandedDecl::operator=(BrandedDecl& other) {
  body = other.body;
  source = other.source;
  if (body.is<Resolver::ResolvedDecl>()) {
    brand = kj::addRef(*other.brand);
  }
  return *this;
}